

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_growable_writer_teardown(mpack_writer_t *writer)

{
  char *__ptr;
  ulong uVar1;
  
  if (writer->error == mpack_ok) {
    __ptr = writer->buffer;
    uVar1 = (long)writer->current - (long)__ptr;
    if (uVar1 < (ulong)((long)writer->end - (long)__ptr) >> 1) {
      __ptr = (char *)realloc(__ptr,uVar1 + (uVar1 == 0));
      if (__ptr == (char *)0x0) {
        free(writer->buffer);
        if (writer->error != mpack_ok) {
          return;
        }
        writer->error = mpack_error_memory;
        if (writer->error_fn == (mpack_writer_error_t)0x0) {
          return;
        }
        (*writer->error_fn)(writer,mpack_error_memory);
        return;
      }
      writer->buffer = __ptr;
      writer->current = __ptr + uVar1;
      writer->end = __ptr + uVar1;
    }
    *(char **)writer->reserved[0] = __ptr;
    *(long *)writer->reserved[1] = (long)writer->current - (long)writer->buffer;
  }
  else {
    if (writer->buffer == (char *)0x0) goto LAB_00105e25;
    free(writer->buffer);
  }
  writer->buffer = (char *)0x0;
LAB_00105e25:
  writer->context = (void *)0x0;
  return;
}

Assistant:

static void mpack_growable_writer_teardown(mpack_writer_t* writer) {
    mpack_growable_writer_t* growable_writer = (mpack_growable_writer_t*)mpack_writer_get_reserved(writer);

    if (mpack_writer_error(writer) == mpack_ok) {

        // shrink the buffer to an appropriate size if the data is
        // much smaller than the buffer
        if (mpack_writer_buffer_used(writer) < mpack_writer_buffer_size(writer) / 2) {
            size_t used = mpack_writer_buffer_used(writer);

            // We always return a non-null pointer that must be freed, even if
            // nothing was written. malloc() and realloc() do not necessarily
            // do this so we enforce it ourselves.
            size_t size = (used != 0) ? used : 1;

            char* buffer = (char*)mpack_realloc(writer->buffer, used, size);
            if (!buffer) {
                MPACK_FREE(writer->buffer);
                mpack_writer_flag_error(writer, mpack_error_memory);
                return;
            }
            writer->buffer = buffer;
            writer->end = (writer->current = writer->buffer + used);
        }

        *growable_writer->target_data = writer->buffer;
        *growable_writer->target_size = mpack_writer_buffer_used(writer);
        writer->buffer = NULL;

    } else if (writer->buffer) {
        MPACK_FREE(writer->buffer);
        writer->buffer = NULL;
    }

    writer->context = NULL;
}